

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O0

void __thiscall
cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::
process<std::vector<HighFreqDataType,std::allocator<HighFreqDataType>>&,int&,int&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
          (InputArchive<cereal::PortableBinaryInputArchive,_1U> *this,
          vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> *head,int *tail,int *tail_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail_4,int *tail_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail_6)

{
  int *in_RCX;
  int *in_RDX;
  InputArchive<cereal::PortableBinaryInputArchive,_1U> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  int *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> *in_stack_ffffffffffffffb8;
  InputArchive<cereal::PortableBinaryInputArchive,_1U> *in_stack_ffffffffffffffc0;
  
  process<std::vector<HighFreqDataType,std::allocator<HighFreqDataType>>&>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  process<int&,int&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
            (in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_RDI,unaff_retaddr,in_stack_00000008);
  return;
}

Assistant:

inline
      void process( T && head, Other && ... tail )
      {
        process( std::forward<T>( head ) );
        process( std::forward<Other>( tail )... );
      }